

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O3

CURLcode Curl_getinfo(Curl_easy *data,CURLINFO info,...)

{
  int iVar1;
  connectdata *pcVar2;
  char *pcVar3;
  double dVar4;
  curl_socket_t cVar5;
  curl_sslbackend cVar6;
  void *pvVar7;
  curl_slist *pcVar8;
  byte bVar9;
  char *pcVar10;
  timediff_t *ptVar11;
  curl_tlssessioninfo **tsip;
  CURLcode CVar12;
  va_list arg;
  double *local_c8;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  CVar12 = CURLE_UNKNOWN_OPTION;
  switch((info & 0xf00000) - 0x100000 >> 0x14) {
  case CURLINFO_NONE:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x100031) {
      if ((int)info < 0x10001e) {
        if (info == CURLINFO_EFFECTIVE_URL) {
          pcVar3 = (data->state).url;
          pcVar10 = "";
          if (pcVar3 != (char *)0x0) {
            pcVar10 = pcVar3;
          }
        }
        else if (info == CURLINFO_CONTENT_TYPE) {
          pcVar10 = (data->info).contenttype;
        }
        else {
          if (info != CURLINFO_PRIVATE) {
            return CURLE_UNKNOWN_OPTION;
          }
          pcVar10 = (char *)(data->set).private_data;
        }
      }
      else {
        switch(info) {
        case CURLINFO_FTP_ENTRY_PATH:
          pcVar10 = (data->state).most_recent_ftp_entrypath;
          break;
        case CURLINFO_REDIRECT_URL:
          pcVar10 = (data->info).wouldredirect;
          break;
        case CURLINFO_PRIMARY_IP:
          pcVar10 = (data->info).conn_primary_ip;
          break;
        default:
          goto switchD_005a80a1_default;
        case CURLINFO_RTSP_SESSION_ID:
          pcVar10 = (data->set).str[0x30];
          break;
        case CURLINFO_LOCAL_IP:
          pcVar10 = (data->info).conn_local_ip;
        }
      }
    }
    else if ((int)info < 0x10003d) {
      if (info == CURLINFO_SCHEME) {
        pcVar10 = (data->info).conn_scheme;
      }
      else if (info == CURLINFO_EFFECTIVE_METHOD) {
        pcVar10 = (data->set).str[6];
        if (pcVar10 == (char *)0x0) {
          if (((data->set).field_0x8bd & 8) == 0) {
            bVar9 = (data->state).httpreq - 1;
            if (bVar9 < 5) {
              pcVar10 = &DAT_00804aa4 + *(int *)(&DAT_00804aa4 + (ulong)bVar9 * 4);
            }
            else {
              pcVar10 = "GET";
            }
          }
          else {
            pcVar10 = "HEAD";
          }
        }
      }
      else {
        if (info != CURLINFO_REFERER) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar10 = (data->state).referer;
      }
    }
    else {
      if (1 < info - CURLINFO_CAINFO) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcVar10 = (char *)0x0;
    }
    goto LAB_005a86f0;
  case 1:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_HEADER_SIZE:
      pcVar8 = (curl_slist *)(ulong)(data->info).header_size;
      break;
    case CURLINFO_REQUEST_SIZE:
      pcVar8 = (curl_slist *)(data->info).request_size;
      break;
    case CURLINFO_SSL_VERIFYRESULT:
      pcVar8 = (curl_slist *)(data->set).ssl.certverifyresult;
      break;
    case CURLINFO_FILETIME:
      pcVar8 = (curl_slist *)(data->info).filetime;
      break;
    case 0x20000f:
    case 0x200010:
    case 0x200011:
    case 0x200012:
    case 0x200013:
    case 0x200015:
    case 0x20001b:
    case 0x20001c:
    case 0x20001e:
    case 0x20001f:
    case 0x200020:
    case 0x200021:
    case 0x200022:
    case 0x200024:
    case CURLINFO_RTSP_CLIENT_CSEQ:
    case CURLINFO_RTSP_SERVER_CSEQ:
    case CURLINFO_RTSP_CSEQ_RECV:
    case 0x200029:
    case 0x20002b:
    case 0x20002c:
    case 0x20002d:
      goto switchD_005a80a1_default;
    case CURLINFO_REDIRECT_COUNT:
      pcVar8 = (curl_slist *)(data->state).followlocation;
      break;
    case CURLINFO_HTTP_CONNECTCODE:
      pcVar8 = (curl_slist *)(long)(data->info).httpproxycode;
      break;
    case CURLINFO_HTTPAUTH_AVAIL:
      pcVar8 = (curl_slist *)(data->info).httpauthavail;
      break;
    case CURLINFO_PROXYAUTH_AVAIL:
      pcVar8 = (curl_slist *)(data->info).proxyauthavail;
      break;
    case CURLINFO_OS_ERRNO:
      pcVar8 = (curl_slist *)(long)(data->state).os_errno;
      break;
    case CURLINFO_NUM_CONNECTS:
      pcVar8 = (curl_slist *)(data->info).numconnects;
      break;
    case CURLINFO_LASTSOCKET:
      cVar5 = Curl_getconnectinfo(data,(connectdata **)0x0);
      pcVar8 = (curl_slist *)(long)cVar5;
      break;
    case CURLINFO_CONDITION_UNMET:
      pcVar8 = (curl_slist *)0x1;
      if ((data->info).httpcode != 0x130) {
        pcVar8 = (curl_slist *)(ulong)((byte)(data->info).field_0xe4 & 1);
      }
      break;
    case CURLINFO_PRIMARY_PORT:
      pcVar8 = (curl_slist *)(long)(data->info).conn_primary_port;
      break;
    case CURLINFO_LOCAL_PORT:
      pcVar8 = (curl_slist *)(long)(data->info).conn_local_port;
      break;
    case CURLINFO_HTTP_VERSION:
      iVar1 = (data->info).httpversion;
      if (iVar1 < 0x14) {
        if (iVar1 == 10) {
          pcVar8 = (curl_slist *)0x1;
        }
        else if (iVar1 == 0xb) {
          pcVar8 = (curl_slist *)0x2;
        }
        else {
LAB_005a8814:
          pcVar8 = (curl_slist *)0x0;
        }
      }
      else if (iVar1 == 0x14) {
        pcVar8 = (curl_slist *)0x3;
      }
      else {
        if (iVar1 != 0x1e) goto LAB_005a8814;
        pcVar8 = (curl_slist *)&DAT_0000001e;
      }
      break;
    case CURLINFO_PROXY_SSL_VERIFYRESULT:
      pcVar8 = (curl_slist *)(data->set).proxy_ssl.certverifyresult;
      break;
    case CURLINFO_PROTOCOL:
      pcVar8 = (curl_slist *)(ulong)(data->info).conn_protocol;
      break;
    default:
      if (info == CURLINFO_PROXY_ERROR) {
        pcVar8 = (curl_slist *)(ulong)(data->info).pxcode;
      }
      else {
        if (info != CURLINFO_RESPONSE_CODE) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar8 = (curl_slist *)(long)(data->info).httpcode;
      }
    }
LAB_005a87cc:
    *local_c8 = (double)pcVar8;
    goto LAB_005a87d0;
  case 2:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    break;
  case 3:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x400022) {
      if (info == CURLINFO_SSL_ENGINES) {
        pcVar8 = Curl_ssl_engines_list(data);
      }
      else {
        if (info != CURLINFO_COOKIELIST) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar8 = Curl_cookie_list(data);
      }
      goto LAB_005a87cc;
    }
    if (info != CURLINFO_CERTINFO) {
      if ((info != CURLINFO_TLS_SESSION) && (info != CURLINFO_TLS_SSL_PTR)) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcVar2 = data->conn;
      *local_c8 = (double)&data->tsi;
      cVar6 = Curl_ssl_backend();
      (data->tsi).backend = cVar6;
      (data->tsi).internals = (void *)0x0;
      if (cVar6 == CURLSSLBACKEND_NONE || pcVar2 == (connectdata *)0x0) {
        return CURLE_OK;
      }
      pvVar7 = Curl_ssl_get_internals(data,0,info,0);
      (data->tsi).internals = pvVar7;
      return CURLE_OK;
    }
    *local_c8 = (double)&(data->info).certs;
    goto LAB_005a87d0;
  case 4:
    if (info != CURLINFO_ACTIVESOCKET) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    cVar5 = Curl_getconnectinfo(data,(connectdata **)0x0);
    *(curl_socket_t *)local_c8 = cVar5;
    return CURLE_OK;
  case 5:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_TOTAL_TIME_T:
      ptVar11 = &(data->progress).timespent;
      break;
    case CURLINFO_NAMELOOKUP_TIME_T:
      ptVar11 = &(data->progress).t_nslookup;
      break;
    case CURLINFO_CONNECT_TIME_T:
      ptVar11 = &(data->progress).t_connect;
      break;
    case CURLINFO_PRETRANSFER_TIME_T:
      ptVar11 = &(data->progress).t_pretransfer;
      break;
    case CURLINFO_STARTTRANSFER_TIME_T:
      ptVar11 = &(data->progress).t_starttransfer;
      break;
    case CURLINFO_REDIRECT_TIME_T:
      ptVar11 = &(data->progress).t_redirect;
      break;
    case CURLINFO_APPCONNECT_TIME_T:
      ptVar11 = &(data->progress).t_appconnect;
      break;
    case CURLINFO_RETRY_AFTER:
      ptVar11 = &(data->info).retry_after;
      break;
    case 0x60003a:
    case 0x60003b:
    case 0x60003c:
    case 0x60003d:
    case 0x60003e:
      goto switchD_005a80a1_default;
    case CURLINFO_XFER_ID:
      ptVar11 = &data->id;
      break;
    case CURLINFO_CONN_ID:
      ptVar11 = &(data->state).recent_conn_id;
      if (data->conn != (connectdata *)0x0) {
        ptVar11 = &data->conn->connection_id;
      }
      break;
    case CURLINFO_QUEUE_TIME_T:
      ptVar11 = &(data->progress).t_postqueue;
      break;
    default:
      switch(info) {
      case CURLINFO_SIZE_UPLOAD_T:
        ptVar11 = &(data->progress).uploaded;
        break;
      case CURLINFO_SIZE_DOWNLOAD_T:
        ptVar11 = &(data->progress).downloaded;
        break;
      case CURLINFO_SPEED_DOWNLOAD_T:
        ptVar11 = &(data->progress).dlspeed;
        break;
      case CURLINFO_SPEED_UPLOAD_T:
        ptVar11 = &(data->progress).ulspeed;
        break;
      default:
        goto switchD_005a80a1_default;
      case CURLINFO_FILETIME_T:
        ptVar11 = &(data->info).filetime;
        break;
      case CURLINFO_CONTENT_LENGTH_DOWNLOAD_T:
        pcVar10 = (char *)0xffffffffffffffff;
        if (((data->progress).flags & 0x40) != 0) {
          ptVar11 = &(data->progress).size_dl;
          break;
        }
        goto LAB_005a86f0;
      case CURLINFO_CONTENT_LENGTH_UPLOAD_T:
        pcVar10 = (char *)0xffffffffffffffff;
        if (((data->progress).flags & 0x20) == 0) goto LAB_005a86f0;
        ptVar11 = &(data->progress).size_ul;
      }
    }
    pcVar10 = (char *)*ptVar11;
LAB_005a86f0:
    *local_c8 = (double)pcVar10;
    goto LAB_005a87d0;
  default:
    goto switchD_005a80a1_default;
  }
  switch(info) {
  case CURLINFO_TOTAL_TIME:
    dVar4 = (double)(data->progress).timespent;
    break;
  case CURLINFO_NAMELOOKUP_TIME:
    dVar4 = (double)(data->progress).t_nslookup;
    break;
  case CURLINFO_CONNECT_TIME:
    dVar4 = (double)(data->progress).t_connect;
    break;
  case CURLINFO_PRETRANSFER_TIME:
    dVar4 = (double)(data->progress).t_pretransfer;
    break;
  case CURLINFO_SIZE_UPLOAD:
    dVar4 = (double)(data->progress).uploaded;
    goto LAB_005a85ce;
  case CURLINFO_SIZE_DOWNLOAD:
    dVar4 = (double)(data->progress).downloaded;
    goto LAB_005a85ce;
  case CURLINFO_SPEED_DOWNLOAD:
    dVar4 = (double)(data->progress).dlspeed;
    goto LAB_005a85ce;
  case CURLINFO_SPEED_UPLOAD:
    dVar4 = (double)(data->progress).ulspeed;
    goto LAB_005a85ce;
  default:
    goto switchD_005a80a1_default;
  case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
    if (((data->progress).flags & 0x40) == 0) {
LAB_005a8617:
      dVar4 = -1.0;
    }
    else {
      dVar4 = (double)(data->progress).size_dl;
    }
    goto LAB_005a85ce;
  case CURLINFO_CONTENT_LENGTH_UPLOAD:
    if (((data->progress).flags & 0x20) == 0) goto LAB_005a8617;
    dVar4 = (double)(data->progress).size_ul;
    goto LAB_005a85ce;
  case CURLINFO_STARTTRANSFER_TIME:
    dVar4 = (double)(data->progress).t_starttransfer;
    break;
  case CURLINFO_REDIRECT_TIME:
    dVar4 = (double)(data->progress).t_redirect;
    break;
  case CURLINFO_APPCONNECT_TIME:
    dVar4 = (double)(data->progress).t_appconnect;
  }
  dVar4 = dVar4 / 1000000.0;
LAB_005a85ce:
  *local_c8 = dVar4;
LAB_005a87d0:
  CVar12 = CURLE_OK;
switchD_005a80a1_default:
  return CVar12;
}

Assistant:

CURLcode Curl_getinfo(struct Curl_easy *data, CURLINFO info, ...)
{
  va_list arg;
  long *param_longp = NULL;
  double *param_doublep = NULL;
  curl_off_t *param_offt = NULL;
  const char **param_charp = NULL;
  struct curl_slist **param_slistp = NULL;
  curl_socket_t *param_socketp = NULL;
  int type;
  CURLcode result = CURLE_UNKNOWN_OPTION;

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  va_start(arg, info);

  type = CURLINFO_TYPEMASK & (int)info;
  switch(type) {
  case CURLINFO_STRING:
    param_charp = va_arg(arg, const char **);
    if(param_charp)
      result = getinfo_char(data, info, param_charp);
    break;
  case CURLINFO_LONG:
    param_longp = va_arg(arg, long *);
    if(param_longp)
      result = getinfo_long(data, info, param_longp);
    break;
  case CURLINFO_DOUBLE:
    param_doublep = va_arg(arg, double *);
    if(param_doublep)
      result = getinfo_double(data, info, param_doublep);
    break;
  case CURLINFO_OFF_T:
    param_offt = va_arg(arg, curl_off_t *);
    if(param_offt)
      result = getinfo_offt(data, info, param_offt);
    break;
  case CURLINFO_SLIST:
    param_slistp = va_arg(arg, struct curl_slist **);
    if(param_slistp)
      result = getinfo_slist(data, info, param_slistp);
    break;
  case CURLINFO_SOCKET:
    param_socketp = va_arg(arg, curl_socket_t *);
    if(param_socketp)
      result = getinfo_socket(data, info, param_socketp);
    break;
  default:
    break;
  }

  va_end(arg);

  return result;
}